

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

bool __thiscall cppurses::Event::send_to_all_filters(Event *this)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var3 = &(this->receiver_->event_filters_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (this->receiver_->event_filters_)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left; (_Rb_tree_header *)p_Var2 != p_Var3;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(char *)(*(long *)(p_Var2 + 1) + 0x328) == '\x01') {
      iVar1 = (*this->_vptr_Event[3])(this);
      if ((char)iVar1 != '\0') break;
    }
  }
  return (_Rb_tree_header *)p_Var2 != p_Var3;
}

Assistant:

auto Event::send_to_all_filters() const -> bool
{
    auto const& filters = receiver_.get_event_filters();
    for (Widget* filter : filters) {
        if (filter->enabled() && this->filter_send(*filter))
            return true;
    }
    return false;
}